

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAProtocol.h
# Opt level: O2

int AnalyzeSentenceNMEA(char *buf,int buflen,char *talkerid,char *mnemonic,int *psentencelen,
                       int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  undefined8 uStack_38;
  char checksum [4];
  
  *psentencelen = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 3) {
    *pnbBytesToRequest = 3 - buflen;
  }
  else {
    if ((0x3a < (ulong)(byte)*buf) || ((0x400001200000000U >> ((ulong)(byte)*buf & 0x3f) & 1) == 0))
    {
LAB_00123114:
      *pnbBytesToDiscard = 1;
      return 1;
    }
    talkerid[0] = '\0';
    talkerid[1] = '\0';
    talkerid[2] = '\0';
    mnemonic[4] = '\0';
    mnemonic[5] = '\0';
    mnemonic[0] = '\0';
    mnemonic[1] = '\0';
    mnemonic[2] = '\0';
    mnemonic[3] = '\0';
    uVar5 = 9;
    if ((uint)buflen < 9) {
      uVar5 = (ulong)(uint)buflen;
    }
    uVar1 = (uint)uVar5;
    for (uVar4 = 1; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      if (((ulong)(byte)buf[uVar4] < 0x2d) &&
         ((0x140000002400U >> ((ulong)(byte)buf[uVar4] & 0x3f) & 1) != 0)) {
        uVar1 = (uint)uVar4;
        break;
      }
    }
    if (uVar1 != buflen) {
      uVar6 = 2;
      if (uVar1 < 6) {
        if (uVar1 == 5) {
          uVar6 = 1;
        }
        else if (uVar1 != 3) goto LAB_00123114;
      }
      for (uVar5 = 1; uVar5 - uVar6 != 1; uVar5 = uVar5 + 1) {
        talkerid[uVar5 - 1] = buf[uVar5];
      }
      uVar4 = 0;
      if (0 < (int)(uVar1 + ~uVar6)) {
        uVar4 = (ulong)(uVar1 + ~uVar6);
      }
      while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
        *mnemonic = buf[uVar5];
        uVar5 = uVar5 + 1;
        mnemonic = mnemonic + 1;
      }
      uVar1 = (int)uVar5 + 2;
      for (; uVar5 < (uint)buflen; uVar5 = uVar5 + 1) {
        if ((buf[uVar5] == '\n') || (buf[uVar5] == '\r')) {
          uVar6 = uVar1 - 1;
          if ((int)uVar6 < buflen) {
            uVar7 = 2;
            if ((buf[uVar6] != '\n') && (buf[uVar6] != '\r')) goto LAB_001230a8;
          }
          else {
LAB_001230a8:
            uVar7 = 1;
            uVar1 = uVar6;
          }
          *psentencelen = uVar1;
          if (buf[(int)(uVar1 + -uVar7 + -3)] != '*') {
            return 0;
          }
          uStack_38 = in_RAX;
          ComputeChecksumNMEA(buf,uVar1,checksum);
          iVar3 = *psentencelen;
          iVar2 = toupper((int)buf[(int)(iVar3 + -uVar7 + -2)]);
          if (iVar2 == checksum[1]) {
            iVar3 = toupper((int)buf[(int)(iVar3 + ~uVar7)]);
            if (iVar3 == checksum[2]) {
              return 0;
            }
          }
          goto LAB_00123114;
        }
        uVar1 = uVar1 + 1;
      }
    }
    *pnbBytesToRequest = 1;
  }
  return 6;
}

Assistant:

inline int AnalyzeSentenceNMEA(char* buf, int buflen, char* talkerid, char* mnemonic, int* psentencelen, 
								   int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	int offset = 0, i = 0, nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA, nb_bytes_mnemonic = MIN_NB_BYTES_MNEMONIC_NMEA, nb_bytes_end = MIN_NB_BYTES_END_NMEA;
	char checksum[MAX_NB_BYTES_CHECKSUM_NMEA+1]; // +1 for the null terminator character for strings.

	*psentencelen = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < MIN_NB_BYTES_SENTENCE_NMEA)
	{
		*pnbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if (((buf[0] != '$')&&(buf[0] != '!')&&(buf[0] != ':')))
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	memset(talkerid, 0, MAX_NB_BYTES_TALKER_ID_NMEA+1); // +1 for the null terminator character for strings.
	memset(mnemonic, 0, MAX_NB_BYTES_MNEMONIC_NMEA+1); // +1 for the null terminator character for strings.
	// Start at i = 1 because of the start character...
	for (i = 1; i < min(buflen, 1+MAX_NB_BYTES_ADDRESS_NMEA+1); i++)
	{
		if ((buf[i] == ',')||(buf[i] == '*')||(buf[i] == '\r')||(buf[i] == '\n')) break;
	}
	if (i == buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	else if (i >= DEFAULT_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == MIN_NB_BYTES_TALKER_ID_NMEA+DEFAULT_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = MIN_NB_BYTES_TALKER_ID_NMEA;
	}
	else if (i == DEFAULT_NB_BYTES_TALKER_ID_NMEA+MIN_NB_BYTES_MNEMONIC_NMEA+1)
	{
		nb_bytes_talkerid = DEFAULT_NB_BYTES_TALKER_ID_NMEA;
	}
	else
	{
		*pnbBytesToDiscard = 1; // We are only sure that the start character can be discarded...
		return EXIT_FAILURE;
	}

	nb_bytes_mnemonic = i-nb_bytes_talkerid-1;
	
	offset = 1;
	for (i = 0; i < nb_bytes_talkerid; i++)
	{
		talkerid[i] = buf[offset];
		offset++;
	}
	for (i = 0; i < nb_bytes_mnemonic; i++)
	{
		mnemonic[i] = buf[offset];
		offset++;
	}

	// Line endings problems...

	while (offset < buflen)
	{
		if ((buf[offset] == '\r')||(buf[offset] == '\n')) break;
		offset++;
	}
	if (offset >= buflen)
	{
		*pnbBytesToRequest = nb_bytes_end;
		return EXIT_OUT_OF_MEMORY;
	}
	offset++;
	if (offset < buflen)
	{
		if ((buf[offset] != '\n')&&(buf[offset] != '\r'))
		{
			*psentencelen = offset;
		}
		else 
		{
			*psentencelen = offset+1;
			nb_bytes_end = MAX_NB_BYTES_END_NMEA;
		}
	}
	else
	{
		*psentencelen = offset;
	}

	// If there is a checksum, check it.
	if (buf[*psentencelen-MAX_NB_BYTES_CHECKSUM_NMEA-nb_bytes_end] == '*')
	{
		ComputeChecksumNMEA(buf, *psentencelen, checksum);
		if ((toupper(buf[*psentencelen-2-nb_bytes_end]) != checksum[1])||(toupper(buf[*psentencelen-1-nb_bytes_end]) != checksum[2]))
		{ 
			PRINT_DEBUG_MESSAGE_OSUTILS(("Warning : NMEA checksum error (computed \"%.3s\", found \"*%c%c\"). \n", checksum, buf[*psentencelen-2-nb_bytes_end], buf[*psentencelen-1-nb_bytes_end]));
			//for (i = 0; i < buflen; i++) printf("%c", buf[i]);
			//printf("\n");
			//for (i = 0; i < buflen; i++) printf("0x%02x ", (unsigned)buf[i]);			
			//printf("\n");
			//*pnbBytesToDiscard = *psentencelen;
			*pnbBytesToDiscard = 1; // Not sure more than the start character can be discarded...
			return EXIT_FAILURE;	
		}
	}

	return EXIT_SUCCESS;
}